

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion_motion_blur_device.cpp
# Opt level: O1

void device_init(char *cfg)

{
  Sphere *pSVar1;
  int iVar2;
  
  embree::sphereIntersectFuncPtr = embree::sphereIntersectFunc;
  embree::data = 0;
  DAT_002cfd58 = (RTCScene)0x0;
  _DAT_002cfd60 = 0;
  DAT_002cfd68 = (Sphere *)0x0;
  _DAT_002cfd70 = 0;
  DAT_002cfd74 = 1;
  _DAT_002cfd78 = 0;
  DAT_002cfd80._0_4_ = 0;
  DAT_002cfd80._4_4_ = 0;
  DAT_002cfd88 = 0;
  _DAT_002cfd8c = 0;
  _DAT_002cfda0 = 0;
  uRam00000000002cfda8 = 0;
  _DAT_002cfdb0 = 0;
  uRam00000000002cfdb8 = 0;
  _DAT_002cfdc0 = 0;
  uRam00000000002cfdc8 = 0;
  _DAT_002cfdd0 = 0;
  uRam00000000002cfdd8 = 0;
  embree::g_scene = rtcNewScene(g_device);
  embree::data = embree::g_scene;
  DAT_002cfd58 = (RTCScene)rtcNewScene(g_device);
  iVar2 = 1;
  pSVar1 = embree::createAnalyticalSpheres(DAT_002cfd58,1);
  DAT_002cfd68 = pSVar1;
  *(undefined8 *)&(pSVar1->p).field_0 = 0;
  *(undefined8 *)((long)&(pSVar1->p).field_0 + 8) = 0;
  DAT_002cfd68->r = 1.0;
  rtcCommitScene(DAT_002cfd58);
  embree::g_instance_linear_0 = rtcNewGeometry(g_device,0x79);
  embree::g_instance_linear_1 = rtcNewGeometry(g_device,0x79);
  embree::g_instance_quaternion_0 = rtcNewGeometry(g_device,0x79);
  embree::g_instance_quaternion_1 = rtcNewGeometry(g_device,0x79);
  rtcSetGeometryInstancedScene(embree::g_instance_linear_0,DAT_002cfd58);
  rtcSetGeometryInstancedScene(embree::g_instance_linear_1,DAT_002cfd58);
  rtcSetGeometryInstancedScene(embree::g_instance_quaternion_0,DAT_002cfd58);
  rtcSetGeometryInstancedScene(embree::g_instance_quaternion_1,DAT_002cfd58);
  embree::updateTransformation();
  do {
    rtcAttachGeometry(embree::data,embree::g_instance_linear_0);
    rtcAttachGeometry(embree::data,embree::g_instance_linear_1);
    rtcAttachGeometry(embree::data,embree::g_instance_quaternion_0);
    rtcAttachGeometry(embree::data,embree::g_instance_quaternion_1);
    iVar2 = iVar2 + -1;
  } while (iVar2 == 0);
  rtcReleaseGeometry(embree::g_instance_linear_0);
  rtcReleaseGeometry(embree::g_instance_linear_1);
  rtcReleaseGeometry(embree::g_instance_quaternion_0);
  rtcReleaseGeometry(embree::g_instance_quaternion_1);
  rtcCommitGeometry(embree::g_instance_linear_0);
  rtcCommitGeometry(embree::g_instance_linear_1);
  rtcCommitGeometry(embree::g_instance_quaternion_0);
  rtcCommitGeometry(embree::g_instance_quaternion_1);
  rtcCommitScene(embree::data);
  _DAT_002cfd60 = rtcGetSceneTraversable(embree::data);
  return;
}

Assistant:

void device_init (char* cfg)
{
  sphereIntersectFuncPtr = GET_FUNCTION_POINTER(sphereIntersectFunc);
  
  /* create scene */
  TutorialData_Constructor(&data);
  g_scene = data.g_scene = rtcNewScene(g_device);

  /* create scene with 4 analytical spheres */
  data.g_scene0 = rtcNewScene(g_device);
  data.g_spheres = createAnalyticalSpheres(data.g_scene0, 1);
  data.g_spheres[0].p = Vec3fa(0, 0, 0);
  data.g_spheres[0].r = 1.0f;
  rtcCommitScene(data.g_scene0);

  // attach multiple times otherwise Embree will optimize and not use
  // internal instancing (magic!)
  g_instance_linear_0 = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  g_instance_linear_1 = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  g_instance_quaternion_0 = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  g_instance_quaternion_1 = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  rtcSetGeometryInstancedScene(g_instance_linear_0, data.g_scene0);
  rtcSetGeometryInstancedScene(g_instance_linear_1, data.g_scene0);
  rtcSetGeometryInstancedScene(g_instance_quaternion_0, data.g_scene0);
  rtcSetGeometryInstancedScene(g_instance_quaternion_1, data.g_scene0);
  updateTransformation();
  for (int i = 0; i < 2; ++i)
  {
    rtcAttachGeometry(data.g_scene, g_instance_linear_0);
    rtcAttachGeometry(data.g_scene, g_instance_linear_1);
    rtcAttachGeometry(data.g_scene, g_instance_quaternion_0);
    rtcAttachGeometry(data.g_scene, g_instance_quaternion_1);
  }
  rtcReleaseGeometry(g_instance_linear_0);
  rtcReleaseGeometry(g_instance_linear_1);
  rtcReleaseGeometry(g_instance_quaternion_0);
  rtcReleaseGeometry(g_instance_quaternion_1);
  rtcCommitGeometry(g_instance_linear_0);
  rtcCommitGeometry(g_instance_linear_1);
  rtcCommitGeometry(g_instance_quaternion_0);
  rtcCommitGeometry(g_instance_quaternion_1);

  rtcCommitScene (data.g_scene);
  data.g_traversable = rtcGetSceneTraversable(data.g_scene);
}